

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GenUnPackForStructVector
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  IdlNamer *this_00;
  char cVar1;
  Value *type;
  string package_reference;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> one_instance;
  string field_type;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string struct_var;
  string field_method;
  string field_field;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(&field_field,this_00);
  (*(this->namer_).super_Namer._vptr_Namer[4])(&field_method,this_00,field);
  (*(this_00->super_Namer)._vptr_Namer[7])(&struct_var,this_00,struct_def);
  GenIndents_abi_cxx11_(&local_1c8,this,2);
  std::operator+(&local_1a8,&local_1c8,"if not ");
  std::operator+(&local_1e8,&local_1a8,&struct_var);
  std::operator+(&package_reference,&local_1e8,".");
  std::operator+(&one_instance,&package_reference,&field_method);
  std::operator+(&field_type,&one_instance,"IsNone():");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&field_type);
  std::__cxx11::string::~string((string *)&one_instance);
  std::__cxx11::string::~string((string *)&package_reference);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  GenIndents_abi_cxx11_(&local_1e8,this,3);
  std::operator+(&package_reference,&local_1e8,"self.");
  std::operator+(&one_instance,&package_reference,&field_field);
  std::operator+(&field_type,&one_instance," = []");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&field_type);
  std::__cxx11::string::~string((string *)&one_instance);
  std::__cxx11::string::~string((string *)&package_reference);
  std::__cxx11::string::~string((string *)&local_1e8);
  GenIndents_abi_cxx11_(&local_1c8,this,3);
  std::operator+(&local_1a8,&local_1c8,"for i in range(");
  std::operator+(&local_1e8,&local_1a8,&struct_var);
  std::operator+(&package_reference,&local_1e8,".");
  std::operator+(&one_instance,&package_reference,&field_method);
  std::operator+(&field_type,&one_instance,"Length()):");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&field_type);
  std::__cxx11::string::~string((string *)&one_instance);
  std::__cxx11::string::~string((string *)&package_reference);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  type = &field->value;
  GenTypeGet_abi_cxx11_(&field_type,this,&type->type);
  std::operator+(&one_instance,&field_type,"_");
  cVar1 = CharToLower(*one_instance._M_dataplus._M_p);
  *one_instance._M_dataplus._M_p = cVar1;
  if ((((this->super_BaseGenerator).parser_)->opts).include_dependence_headers == true) {
    GenPackageReference_abi_cxx11_(&package_reference,this,&type->type);
    std::operator+(&local_1a8,&package_reference,".");
    GenTypeGet_abi_cxx11_(&local_1c8,this,&type->type);
    std::operator+(&local_1e8,&local_1a8,&local_1c8);
    std::__cxx11::string::operator=((string *)&field_type,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&package_reference);
  }
  GenIndents_abi_cxx11_(&local_148,this,4);
  std::operator+(&local_128,&local_148,"if ");
  std::operator+(&local_1c8,&local_128,&struct_var);
  std::operator+(&local_1a8,&local_1c8,".");
  std::operator+(&local_1e8,&local_1a8,&field_method);
  std::operator+(&package_reference,&local_1e8,"(i) is None:");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&package_reference);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  GenIndents_abi_cxx11_(&local_1c8,this,5);
  std::operator+(&local_1a8,&local_1c8,"self.");
  std::operator+(&local_1e8,&local_1a8,&field_field);
  std::operator+(&package_reference,&local_1e8,".append(None)");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&package_reference);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  GenIndents_abi_cxx11_(&local_1e8,this,4);
  std::operator+(&package_reference,&local_1e8,"else:");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&package_reference);
  std::__cxx11::string::~string((string *)&local_1e8);
  GenIndents_abi_cxx11_(&local_88,this,5);
  std::operator+(&local_68,&local_88,&one_instance);
  std::operator+(&local_48,&local_68," = ");
  Namer::ObjectType(&local_a8,&this_00->super_Namer,&field_type);
  std::operator+(&local_148,&local_48,&local_a8);
  std::operator+(&local_128,&local_148,".InitFromObj(");
  std::operator+(&local_1c8,&local_128,&struct_var);
  std::operator+(&local_1a8,&local_1c8,".");
  std::operator+(&local_1e8,&local_1a8,&field_method);
  std::operator+(&package_reference,&local_1e8,"(i))");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&package_reference);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  GenIndents_abi_cxx11_(&local_148,this,5);
  std::operator+(&local_128,&local_148,"self.");
  std::operator+(&local_1c8,&local_128,&field_field);
  std::operator+(&local_1a8,&local_1c8,".append(");
  std::operator+(&local_1e8,&local_1a8,&one_instance);
  std::operator+(&package_reference,&local_1e8,")");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&package_reference);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&one_instance);
  std::__cxx11::string::~string((string *)&field_type);
  std::__cxx11::string::~string((string *)&struct_var);
  std::__cxx11::string::~string((string *)&field_method);
  std::__cxx11::string::~string((string *)&field_field);
  return;
}

Assistant:

void GenUnPackForStructVector(const StructDef &struct_def,
                                const FieldDef &field,
                                std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto field_field = namer_.Field(field);
    const auto field_method = namer_.Method(field);
    const auto struct_var = namer_.Variable(struct_def);

    code += GenIndents(2) + "if not " + struct_var + "." + field_method +
            "IsNone():";
    code += GenIndents(3) + "self." + field_field + " = []";
    code += GenIndents(3) + "for i in range(" + struct_var + "." +
            field_method + "Length()):";

    auto field_type = TypeName(field);
    auto one_instance = field_type + "_";
    one_instance[0] = CharToLower(one_instance[0]);
    if (parser_.opts.include_dependence_headers) {
      auto package_reference = GenPackageReference(field.value.type);
      field_type = package_reference + "." + TypeName(field);
    }
    code += GenIndents(4) + "if " + struct_var + "." + field_method +
            "(i) is None:";
    code += GenIndents(5) + "self." + field_field + ".append(None)";
    code += GenIndents(4) + "else:";
    code += GenIndents(5) + one_instance + " = " +
            namer_.ObjectType(field_type) + ".InitFromObj(" + struct_var + "." +
            field_method + "(i))";
    code +=
        GenIndents(5) + "self." + field_field + ".append(" + one_instance + ")";
  }